

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::addFieldName(DataDictionary *this,int field,string *name)

{
  string *psVar1;
  ConfigError *this_00;
  mapped_type *this_01;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Base_ptr local_78;
  undefined1 local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  _Base_ptr local_30;
  undefined1 local_28;
  string *local_20;
  string *name_local;
  DataDictionary *pDStack_10;
  int field_local;
  DataDictionary *this_local;
  
  local_20 = name;
  name_local._4_4_ = field;
  pDStack_10 = this;
  std::make_pair<std::__cxx11::string_const&,int&>(&local_58,name,(int *)((long)&name_local + 4));
  _Var2 = std::
          map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::insert<std::pair<std::__cxx11::string,int>>
                    ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&this->m_names,&local_58);
  local_78 = (_Base_ptr)_Var2.first._M_node;
  local_70 = _Var2.second;
  local_30 = local_78;
  local_28 = local_70;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_58);
  psVar1 = local_20;
  if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::operator+(&local_b8,"Field named ",local_20);
    std::operator+(&local_98,&local_b8," defined multiple times");
    ConfigError::ConfigError(this_00,&local_98);
    __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  this_01 = std::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_fieldNames,(key_type *)((long)&name_local + 4));
  std::__cxx11::string::operator=((string *)this_01,(string *)psVar1);
  return;
}

Assistant:

void addFieldName(int field, const std::string &name) {
    if (m_names.insert(std::make_pair(name, field)).second == false) {
      throw ConfigError("Field named " + name + " defined multiple times");
    }
    m_fieldNames[field] = name;
  }